

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QTextObject ** __thiscall
QMap<int,_QTextObject_*>::operator[](QMap<int,_QTextObject_*> *this,int *key)

{
  bool bVar1;
  QMapData<std::map<int,_QTextObject_*,_std::less<int>,_std::allocator<std::pair<const_int,_QTextObject_*>_>_>_>
  *pQVar2;
  pointer ppVar3;
  int *in_RSI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_QTextObject_*>_>,_bool> pVar4;
  iterator i;
  QMap<int,_QTextObject_*> copy;
  map<int,_QTextObject_*,_std::less<int>,_std::allocator<std::pair<const_int,_QTextObject_*>_>_>
  *in_stack_ffffffffffffff78;
  QTextObject **ppQVar5;
  QMap<int,_QTextObject_*> *in_stack_ffffffffffffff80;
  value_type *__x;
  pair<const_int,_QTextObject_*> *this_00;
  QTextObject *local_48;
  pair<const_int,_QTextObject_*> local_40;
  _Self local_30;
  _Self local_28;
  undefined1 *local_20;
  _Base_ptr local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTextObject_*,_std::less<int>,_std::allocator<std::pair<const_int,_QTextObject_*>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffff80->d);
  if (bVar1) {
    QMap(in_stack_ffffffffffffff80,(QMap<int,_QTextObject_*> *)in_stack_ffffffffffffff78);
  }
  else {
    memset(&local_20,0,8);
    QMap((QMap<int,_QTextObject_*> *)0x7d9293);
  }
  detach(in_stack_ffffffffffffff80);
  local_28._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTextObject_*,_std::less<int>,_std::allocator<std::pair<const_int,_QTextObject_*>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTextObject_*,_std::less<int>,_std::allocator<std::pair<const_int,_QTextObject_*>_>_>_>_>
                *)0x7d92b3);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_QTextObject_*,_std::less<int>,_std::allocator<std::pair<const_int,_QTextObject_*>_>_>
       ::find(in_stack_ffffffffffffff78,(key_type *)0x7d92c4);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTextObject_*,_std::less<int>,_std::allocator<std::pair<const_int,_QTextObject_*>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTextObject_*,_std::less<int>,_std::allocator<std::pair<const_int,_QTextObject_*>_>_>_>_>
                *)0x7d92d3);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_QTextObject_*,_std::less<int>,_std::allocator<std::pair<const_int,_QTextObject_*>_>_>
       ::end(in_stack_ffffffffffffff78);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    pQVar2 = QtPrivate::
             QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTextObject_*,_std::less<int>,_std::allocator<std::pair<const_int,_QTextObject_*>_>_>_>_>
             ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTextObject_*,_std::less<int>,_std::allocator<std::pair<const_int,_QTextObject_*>_>_>_>_>
                           *)0x7d9303);
    __x = (value_type *)&pQVar2->m;
    local_48 = (QTextObject *)0x0;
    this_00 = &local_40;
    std::pair<const_int,_QTextObject_*>::pair<QTextObject_*,_true>(this_00,in_RSI,&local_48);
    pVar4 = std::
            map<int,_QTextObject_*,_std::less<int>,_std::allocator<std::pair<const_int,_QTextObject_*>_>_>
            ::insert((map<int,_QTextObject_*,_std::less<int>,_std::allocator<std::pair<const_int,_QTextObject_*>_>_>
                      *)this_00,__x);
    local_28._M_node = (_Base_ptr)pVar4.first._M_node;
    local_10 = pVar4.second;
    local_18 = local_28._M_node;
  }
  ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_QTextObject_*>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_int,_QTextObject_*>_> *)0x7d936c);
  ppQVar5 = &ppVar3->second;
  ~QMap((QMap<int,_QTextObject_*> *)0x7d937e);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return ppQVar5;
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }